

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O2

void dctInverse8x8_scalar(float *data,int zeroedRows)

{
  float *pfVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  for (uVar3 = 0; (uint)((8 - zeroedRows) * 0x20) != uVar3; uVar3 = uVar3 + 0x20) {
    fVar8 = *(float *)((long)data + uVar3 + 0x10);
    fVar5 = (*(float *)((long)data + uVar3) + fVar8) * 0.35355362;
    fVar6 = (*(float *)((long)data + uVar3) - fVar8) * 0.35355362;
    fVar8 = *(float *)((long)data + uVar3 + 8);
    fVar9 = *(float *)((long)data + uVar3 + 0x18);
    fVar10 = fVar8 * 0.19134216 - fVar9 * 0.46193984;
    fVar7 = fVar9 * 0.19134216 + fVar8 * 0.46193984;
    fVar8 = *(float *)((long)data + uVar3 + 0xc);
    fVar9 = *(float *)((long)data + uVar3 + 4);
    fVar14 = *(float *)((long)data + uVar3 + 0x14);
    fVar4 = *(float *)((long)data + uVar3 + 0x1c);
    fVar11 = fVar4 * 0.097545706 + fVar14 * 0.27778545 + fVar9 * 0.49039266 + fVar8 * 0.41573495;
    fVar12 = fVar4 * -0.27778545 + fVar14 * -0.49039266 + fVar9 * 0.41573495 + fVar8 * -0.097545706;
    fVar13 = fVar4 * 0.41573495 + fVar14 * 0.097545706 + fVar9 * 0.27778545 + fVar8 * -0.49039266;
    fVar14 = fVar4 * -0.49039266 + fVar14 * 0.41573495 + fVar9 * 0.097545706 + fVar8 * -0.27778545;
    fVar8 = fVar10 + fVar6;
    fVar9 = fVar7 + fVar5;
    fVar5 = fVar5 - fVar7;
    fVar6 = fVar6 - fVar10;
    pfVar1 = (float *)((long)data + uVar3);
    *pfVar1 = fVar11 + fVar9;
    pfVar1[1] = fVar12 + fVar8;
    pfVar1[2] = fVar13 + fVar6;
    pfVar1[3] = fVar14 + fVar5;
    pfVar1 = (float *)((long)data + uVar3 + 0x10);
    *pfVar1 = fVar5 - fVar14;
    pfVar1[1] = fVar6 - fVar13;
    pfVar1[2] = fVar8 - fVar12;
    pfVar1[3] = fVar9 - fVar11;
  }
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 4) {
    fVar8 = *(float *)((long)data + lVar2 + 0x60);
    fVar9 = *(float *)((long)data + lVar2 + 0xe0);
    fVar7 = fVar8 * 0.19134216 - fVar9 * 0.46193984;
    fVar10 = fVar9 * 0.19134216 + fVar8 * 0.46193984;
    fVar8 = *(float *)((long)data + lVar2 + 0x40);
    fVar9 = *(float *)((long)data + lVar2 + 0x80);
    fVar14 = *(float *)((long)data + lVar2 + 0xc0);
    fVar4 = *(float *)((long)data + lVar2 + 0x100);
    fVar11 = fVar4 * 0.097545706 + fVar14 * 0.27778545 + fVar8 * 0.49039266 + fVar9 * 0.41573495;
    fVar13 = fVar4 * -0.27778545 + fVar14 * -0.49039266 + fVar8 * 0.41573495 + fVar9 * -0.097545706;
    fVar6 = fVar4 * 0.41573495 + fVar14 * 0.097545706 + fVar8 * 0.27778545 + fVar9 * -0.49039266;
    fVar5 = *(float *)((long)data + lVar2 + 0x20);
    fVar12 = fVar4 * -0.49039266 + fVar14 * 0.41573495 + fVar8 * 0.097545706 + fVar9 * -0.27778545;
    fVar8 = *(float *)((long)data + lVar2 + 0xa0);
    fVar14 = (fVar5 + fVar8) * 0.35355362;
    fVar8 = (fVar5 - fVar8) * 0.35355362;
    fVar9 = fVar7 + fVar8;
    fVar8 = fVar8 - fVar7;
    fVar4 = fVar10 + fVar14;
    fVar14 = fVar14 - fVar10;
    *(float *)((long)data + lVar2 + 0x20) = fVar11 + fVar4;
    *(float *)((long)data + lVar2 + 0x40) = fVar13 + fVar9;
    *(float *)((long)data + lVar2 + 0x60) = fVar6 + fVar8;
    *(float *)((long)data + lVar2 + 0x80) = fVar12 + fVar14;
    *(float *)((long)data + lVar2 + 0xa0) = fVar14 - fVar12;
    *(float *)((long)data + lVar2 + 0xc0) = fVar8 - fVar6;
    *(float *)((long)data + lVar2 + 0xe0) = fVar9 - fVar13;
    *(float *)((long)data + lVar2 + 0x100) = fVar4 - fVar11;
  }
  return;
}

Assistant:

static inline void
dctInverse8x8_scalar (float* data, int zeroedRows)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f * 3.14159f / 16.0f);
    const float e = .5f * cosf (5.f * 3.14159f / 16.0f);
    const float f = .5f * cosf (3.f * 3.14159f / 8.0f);
    const float g = .5f * cosf (7.f * 3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float* rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2];
        alpha[1] = f * rowPtr[2];
        alpha[2] = c * rowPtr[6];
        alpha[3] = f * rowPtr[6];

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16 + column];
        alpha[1] = f * data[16 + column];
        alpha[2] = c * data[48 + column];
        alpha[3] = f * data[48 + column];

        beta[0] = b * data[8 + column] + d * data[24 + column] +
                  e * data[40 + column] + g * data[56 + column];

        beta[1] = d * data[8 + column] - g * data[24 + column] -
                  b * data[40 + column] - e * data[56 + column];

        beta[2] = e * data[8 + column] - b * data[24 + column] +
                  g * data[40 + column] + d * data[56 + column];

        beta[3] = g * data[8 + column] - e * data[24 + column] +
                  d * data[40 + column] - b * data[56 + column];

        theta[0] = a * (data[column] + data[32 + column]);
        theta[3] = a * (data[column] - data[32 + column]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[column]      = gamma[0] + beta[0];
        data[8 + column]  = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}